

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_turn_undead(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  CHAR_DATA **ppCVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CHAR_DATA *pCVar9;
  CHAR_DATA *pCVar10;
  
  bVar3 = is_evil(ch);
  if (bVar3) {
    act("$n turns $s unholy influence upon the room.",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("You turn your unholy influence upon those in the room.\n\r",ch);
    iVar6 = level;
  }
  else {
    act("$n raises $s hands and calls upon the gods to destroy the unholy.",ch,(void *)0x0,
        (void *)0x0,0);
    act("You raise your hands and call upon the gods to destroy the unholy.",ch,(void *)0x0,
        (void *)0x0,3);
    bVar3 = is_good(ch);
    iVar6 = level + -3;
    if (bVar3) {
      iVar6 = level;
    }
  }
  bVar3 = is_evil(ch);
  if (!bVar3) {
    iVar7 = 0;
    pCVar9 = ch->in_room->people;
    while (pCVar10 = pCVar9, pCVar10 != (CHAR_DATA *)0x0) {
      pCVar9 = pCVar10->next_in_room;
      bVar3 = is_same_group(pCVar10,ch);
      if ((!bVar3) && ((pCVar10->act[0] & 0x4000) != 0)) {
        sVar2 = pCVar10->level;
        bVar3 = is_good(ch);
        if (bVar3) {
          iVar7 = iVar6 - sVar2;
          if (iVar7 < 8) {
            iVar7 = 7;
          }
          iVar7 = dice(iVar6,iVar7 + 6);
        }
        if (((((pCVar10->level + 0xf < (int)ch->level) && (bVar3 = is_npc(pCVar10), bVar3)) &&
             (bVar3 = is_good(ch), bVar3)) ||
            ((pCVar10->level + 0x14 < (int)ch->level && (bVar3 = is_npc(pCVar10), bVar3)))) ||
           ((bVar3 = is_good(ch), bVar3 &&
            ((bVar3 = is_npc(pCVar10), bVar3 && (iVar4 = number_percent(), iVar4 < 5)))))) {
          act("$N crumbles to dust from the power of $n\'s turning.",ch,(void *)0x0,pCVar10,0);
          act("$N\'s body crumbles to dust from the power of your turning.",ch,(void *)0x0,pCVar10,3
             );
          raw_kill(ch,pCVar10);
        }
        else {
          bVar3 = saves_spell(iVar6,pCVar10,10);
          iVar4 = iVar7 / 2;
          if (!bVar3) {
            iVar4 = iVar7;
          }
          damage_old(ch,pCVar10,iVar4,sn,10,true);
        }
      }
    }
    return;
  }
  ppCVar5 = &char_list;
  uVar8 = 0;
  iVar6 = 0;
  while (ppCVar5 = &((CHAR_DATA *)ppCVar5)->next->next, (CHAR_DATA *)ppCVar5 != (CHAR_DATA *)0x0) {
    if (((((CHAR_DATA *)ppCVar5)->master == ch) && ((CHAR_DATA *)ppCVar5 != ch)) &&
       ((((CHAR_DATA *)ppCVar5)->act[0] & 0x4000U) != 0)) {
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + ((CHAR_DATA *)ppCVar5)->level;
    }
  }
  pCVar9 = ch->in_room->people;
  do {
    while( true ) {
      do {
        pCVar10 = pCVar9;
        if (pCVar10 == (CHAR_DATA *)0x0) {
          return;
        }
        pCVar9 = pCVar10->next_in_room;
        bVar3 = is_same_group(pCVar10,ch);
      } while (((bVar3) || ((pCVar10->act[0] & 0x4000) == 0)) ||
              (bVar3 = is_affected_by(pCVar10,0x12), bVar3));
      iVar7 = (int)ch->level;
      if (((SBORROW4(iVar7 * 3,iVar6 * 2) == iVar7 * 3 + iVar6 * -2 < 0) &&
          (0x13 < iVar7 || uVar8 == 0)) &&
         ((0x27 < iVar7 || uVar8 < 2 &&
          ((((0x32 < iVar7 || uVar8 < 3 && (pCVar10->level + 10 <= iVar7)) &&
            (bVar3 = saves_spell(iVar7,pCVar10,0x10), !bVar3)) && (bVar3 = is_npc(pCVar10), bVar3)))
          ))) break;
      act("You attempt to control $N but do not have the influence.",ch,(void *)0x0,pCVar10,3);
    }
    act("$n stares in hatred for a moment then suddenly becomes very subdued.",pCVar10,(void *)0x0,
        (void *)0x0,1);
    stop_fighting(pCVar10,true);
    pCVar10->master = ch;
    pCVar10->leader = ch;
    pbVar1 = (byte *)((long)pCVar10->affected_by + 2);
    *pbVar1 = *pbVar1 | 4;
    *(byte *)pCVar10->act = (byte)pCVar10->act[0] & 0xdf;
    act("$N now follows you.",ch,(void *)0x0,pCVar10,3);
    uVar8 = uVar8 + 1;
    iVar6 = iVar6 + pCVar10->level;
  } while( true );
}

Assistant:

void spell_turn_undead(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	CHAR_DATA *v_next;
	int dam = 0;
	int value, count, num;
	CHAR_DATA *follower;

	follower = nullptr; /* follower, count and num used for evil clerics */
	count = 0;
	num = 0;

	if (!is_evil(ch))
	{
		act("$n raises $s hands and calls upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_ROOM);
		act("You raise your hands and call upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_CHAR);

		if (!is_good(ch))
			level -= 3;
	}
	else
	{
		act("$n turns $s unholy influence upon the room.", ch, 0, 0, TO_ROOM);
		send_to_char("You turn your unholy influence upon those in the room.\n\r", ch);
	}

	/*
	if (!is_npc(ch) && ch->pcdata->special == SPEC_PALADIN_HUNTER)
		level += number_range(2,level/7);
	*/

	if (!is_evil(ch))
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			value = std::max(1, level - victim->level + 10);
			value = std::max(13, value - 4);

			if (is_good(ch))
				dam = dice(level, value);

			if (((ch->level > (victim->level + 15)) && is_npc(victim) && is_good(ch))
				|| ((ch->level > (victim->level + 20)) && is_npc(victim))
				|| (is_good(ch) && is_npc(victim) && number_percent() < 5))
			{
				act("$N crumbles to dust from the power of $n's turning.", ch, nullptr, victim, TO_ROOM);
				act("$N's body crumbles to dust from the power of your turning.", ch, nullptr, victim, TO_CHAR);
				raw_kill(ch, victim);
			}
			else
			{

				damage_old(ch, victim, saves_spell(level, victim, DAM_HOLY) ? dam / 2 : dam, sn, DAM_HOLY, true);
			}
		}

		return;
	}
	else
	{
		for (follower = char_list; follower != nullptr; follower = follower->next)
		{
			if (follower->master == ch && IS_SET(follower->act, ACT_UNDEAD) && follower != ch)
			{
				num++;
				count += follower->level;
			}
		}

		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			if (is_affected_by(victim, AFF_CHARM))
				continue;

			if ((ch->level * 3 < count * 2)
				|| (ch->level < 20 && num > 0)
				|| (ch->level < 40 && num > 1)
				|| (ch->level < 51 && num > 2)
				|| (ch->level < (victim->level + 10))
				|| saves_spell(ch->level, victim, DAM_OTHER)
				|| !is_npc(victim))
			{
				act("You attempt to control $N but do not have the influence.", ch, 0, victim, TO_CHAR);
				continue;
			}
			else
			{
				act("$n stares in hatred for a moment then suddenly becomes very subdued.", victim, 0, 0, TO_NOTVICT);
				stop_fighting(victim, true);

				victim->master = ch;
				victim->leader = ch;

				SET_BIT(victim->affected_by, AFF_CHARM);
				REMOVE_BIT(victim->act, ACT_AGGRESSIVE);

				act("$N now follows you.", ch, 0, victim, TO_CHAR);

				num++;
				count += victim->level;
			}
		}
	}
}